

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * multiSelectCollSeq(Parse *pParse,Select *p,int iCol)

{
  CollSeq *local_28;
  CollSeq *pRet;
  int iCol_local;
  Select *p_local;
  Parse *pParse_local;
  
  if (p->pPrior == (Select *)0x0) {
    local_28 = (CollSeq *)0x0;
  }
  else {
    local_28 = multiSelectCollSeq(pParse,p->pPrior,iCol);
  }
  if ((local_28 == (CollSeq *)0x0) && (iCol < p->pEList->nExpr)) {
    local_28 = sqlite3ExprCollSeq(pParse,p->pEList->a[iCol].pExpr);
  }
  return local_28;
}

Assistant:

static CollSeq *multiSelectCollSeq(Parse *pParse, Select *p, int iCol){
  CollSeq *pRet;
  if( p->pPrior ){
    pRet = multiSelectCollSeq(pParse, p->pPrior, iCol);
  }else{
    pRet = 0;
  }
  assert( iCol>=0 );
  /* iCol must be less than p->pEList->nExpr.  Otherwise an error would
  ** have been thrown during name resolution and we would not have gotten
  ** this far */
  if( pRet==0 && ALWAYS(iCol<p->pEList->nExpr) ){
    pRet = sqlite3ExprCollSeq(pParse, p->pEList->a[iCol].pExpr);
  }
  return pRet;
}